

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdRelaxedMadd<float>(Thread *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  Simd<float,_(unsigned_char)__x04_> SVar5;
  byte local_51;
  undefined1 auStack_50 [7];
  u8 i;
  SS result;
  Simd<float,_(unsigned_char)__x04_> a;
  Simd<float,_(unsigned_char)__x04_> b;
  Simd<float,_(unsigned_char)__x04_> c;
  Thread *this_local;
  
  SVar5 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  b.v._8_8_ = SVar5.v._0_8_;
  SVar5 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  b.v._0_8_ = SVar5.v._8_8_;
  a.v._8_8_ = SVar5.v._0_8_;
  SVar5 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  a.v._0_8_ = SVar5.v._8_8_;
  result.v._8_8_ = SVar5.v._0_8_;
  for (local_51 = 0; local_51 < 4; local_51 = local_51 + 1) {
    pfVar4 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(result.v + 2),local_51);
    fVar1 = *pfVar4;
    pfVar4 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(a.v + 2),local_51);
    fVar2 = *pfVar4;
    pfVar4 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)(b.v + 2),local_51);
    fVar3 = *pfVar4;
    pfVar4 = Simd<float,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<float,_(unsigned_char)__x04_> *)auStack_50,local_51);
    *pfVar4 = fVar1 * fVar2 + fVar3;
  }
  SVar5.v[2] = result.v[0];
  SVar5.v[3] = result.v[1];
  SVar5.v[0] = (float)auStack_50._0_4_;
  SVar5.v[1] = stack0xffffffffffffffb4;
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,SVar5);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdRelaxedMadd() {
  using SS = typename Simd128<S>::Type;
  auto c = Pop<SS>();
  auto b = Pop<SS>();
  auto a = Pop<SS>();
  SS result;
  for (u8 i = 0; i < SS::lanes; ++i) {
    result[i] = a[i] * b[i] + c[i];
  }
  Push(result);
  return RunResult::Ok;
}